

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O2

_Bool ransac(Correspondence *matched_points,int npoints,TransformationType type,
            MotionModel *motion_models,int num_desired_motions,_Bool *mem_alloc_failed)

{
  MotionModel *pMVar1;
  double *pdVar2;
  uint uVar3;
  int *piVar4;
  double dVar5;
  _Bool _Var6;
  int i;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  RANSAC_MOTION *__base;
  void *memblk;
  ulong uVar10;
  _Bool _Var11;
  int iVar12;
  RANSAC_MOTION *pRVar13;
  undefined7 in_register_00000011;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  RANSAC_MOTION *pRVar20;
  int j;
  RANSAC_MOTION *motion_b;
  bool bVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  RANSAC_MOTION local_e8;
  undefined1 local_c8 [16];
  FindTransformationFunc local_b0;
  double local_a8;
  double dStack_a0;
  int indices [4];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  uVar8 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  uVar3 = ransac_model_info[uVar8].minpts;
  local_a8 = (double)(ulong)uVar3;
  lVar9 = 0;
  uVar19 = 0;
  if (0 < num_desired_motions) {
    uVar19 = (ulong)(uint)num_desired_motions;
  }
  indices[0] = 0;
  indices[1] = 0;
  indices[2] = 0;
  indices[3] = 0;
  for (; uVar19 * 0x40 != lVar9; lVar9 = lVar9 + 0x40) {
    pdVar2 = (double *)((long)motion_models->params + lVar9 + 0x20);
    *pdVar2 = 0.0;
    pdVar2[1] = 1.0;
    pdVar2 = (double *)((long)motion_models->params + lVar9 + 0x10);
    *pdVar2 = 1.0;
    pdVar2[1] = 0.0;
    pdVar2 = (double *)((long)motion_models->params + lVar9);
    *pdVar2 = 0.0;
    pdVar2[1] = 0.0;
    *(undefined4 *)((long)motion_models->params + lVar9 + 0x38) = 0;
  }
  _Var11 = false;
  if ((npoints != 0) && (_Var11 = false, (int)(uVar3 * 5) <= npoints)) {
    uVar7 = (int)((double)npoints * 0.1);
    if ((int)((double)npoints * 0.1) < (int)uVar3) {
      uVar7 = uVar3;
    }
    __base = (RANSAC_MOTION *)aom_calloc((long)num_desired_motions,0x18);
    memblk = aom_malloc((long)(num_desired_motions + 1) * (long)npoints * 4);
    _Var11 = memblk != (void *)0x0 && __base != (RANSAC_MOTION *)0x0;
    if (memblk != (void *)0x0 && __base != (RANSAC_MOTION *)0x0) {
      pvVar14 = memblk;
      for (lVar9 = 0; uVar19 * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
        *(void **)((long)&__base->inlier_indices + lVar9) = pvVar14;
        pvVar14 = (void *)((long)pvVar14 + (long)npoints * 4);
      }
      local_e8.num_inliers = 0;
      local_e8._4_4_ = 0;
      local_e8.sse = 0.0;
      local_e8.inlier_indices = (int *)((long)memblk + (long)(num_desired_motions * npoints) * 4);
      uVar10 = 0;
      uVar18 = 0;
      if (0 < SUB84(local_a8,0)) {
        uVar18 = (ulong)local_a8 & 0xffffffff;
      }
      local_b0 = ransac_model_info[uVar8].find_transformation;
      uVar16 = (ulong)(uint)npoints;
      pRVar20 = __base;
      while ((int)uVar10 != 0x14) {
        local_c8._0_8_ = uVar10;
        uVar10 = 0;
LAB_00261bd2:
        if (uVar10 != uVar18) {
          do {
            uVar16 = (ulong)((int)uVar16 * 0x41c64e6d + 0x3039);
            uVar15 = 0;
            do {
              iVar12 = (int)(uVar16 * (uint)npoints >> 0x20);
              if (uVar10 == uVar15) {
                indices[uVar10] = iVar12;
                uVar10 = uVar10 + 1;
                goto LAB_00261bd2;
              }
              piVar4 = indices + uVar15;
              uVar15 = uVar15 + 1;
            } while (*piVar4 != iVar12);
          } while( true );
        }
        _Var6 = (*local_b0)(matched_points,indices,SUB84(local_a8,0),(double *)&local_68);
        if (_Var6) {
          (*ransac_model_info[uVar8].score_model)
                    ((double *)&local_68,matched_points,npoints,&local_e8);
          iVar12 = local_e8.num_inliers;
          if (((int)uVar7 <= local_e8.num_inliers) &&
             (_Var6 = is_better_motion(&local_e8,pRVar20), _Var6)) {
            pRVar20->num_inliers = iVar12;
            pRVar20->sse = local_e8.sse;
            piVar4 = pRVar20->inlier_indices;
            pRVar20->inlier_indices = local_e8.inlier_indices;
            uVar10 = uVar19;
            motion_b = __base;
            local_e8.inlier_indices = piVar4;
            while (bVar21 = uVar10 != 0, uVar10 = uVar10 - 1, bVar21) {
              _Var6 = is_better_motion(pRVar20,motion_b);
              pRVar13 = motion_b;
              if (!_Var6) {
                pRVar13 = pRVar20;
              }
              motion_b = motion_b + 1;
              pRVar20 = pRVar13;
            }
          }
        }
        uVar10 = (ulong)(local_c8._0_4_ + 1);
      }
      qsort(__base,(long)num_desired_motions,0x18,compare_motions);
      for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
        if (0 < __base[uVar10].num_inliers) {
          pRVar20 = __base + uVar10;
          iVar17 = 5;
          iVar12 = __base[uVar10].num_inliers;
          while (bVar21 = iVar17 != 0, iVar17 = iVar17 + -1, bVar21) {
            _Var6 = (*local_b0)(matched_points,pRVar20->inlier_indices,iVar12,(double *)&local_68);
            if (!_Var6) goto LAB_00261e29;
            (*ransac_model_info[uVar8].score_model)
                      ((double *)&local_68,matched_points,npoints,&local_e8);
            if (local_e8.num_inliers <= pRVar20->num_inliers) break;
            pRVar20->num_inliers = local_e8.num_inliers;
            pRVar20->sse = local_e8.sse;
            piVar4 = pRVar20->inlier_indices;
            pRVar20->inlier_indices = local_e8.inlier_indices;
            iVar12 = local_e8.num_inliers;
            local_e8.inlier_indices = piVar4;
          }
          motion_models[uVar10].params[4] = local_48;
          (motion_models[uVar10].params + 4)[1] = dStack_40;
          motion_models[uVar10].params[2] = local_58;
          (motion_models[uVar10].params + 2)[1] = dStack_50;
          pMVar1 = motion_models + uVar10;
          *(undefined4 *)pMVar1->params = local_68;
          *(undefined4 *)((long)pMVar1->params + 4) = uStack_64;
          *(undefined4 *)(pMVar1->params + 1) = uStack_60;
          *(undefined4 *)((long)pMVar1->params + 0xc) = uStack_5c;
          for (lVar9 = 0; lVar9 < pRVar20->num_inliers; lVar9 = lVar9 + 1) {
            piVar4 = motion_models[uVar10].inliers;
            local_a8 = matched_points[pRVar20->inlier_indices[lVar9]].x;
            dStack_a0 = matched_points[pRVar20->inlier_indices[lVar9]].y;
            dVar5 = rint(local_a8);
            local_c8._8_4_ = extraout_XMM0_Dc;
            local_c8._0_8_ = dVar5;
            local_c8._12_4_ = extraout_XMM0_Dd;
            dVar5 = rint(dStack_a0);
            *(ulong *)(piVar4 + lVar9 * 2) = CONCAT44((int)dVar5,(int)(double)local_c8._0_8_);
          }
          motion_models[uVar10].num_inliers = pRVar20->num_inliers;
        }
LAB_00261e29:
      }
    }
    else {
      *mem_alloc_failed = true;
    }
    aom_free(memblk);
    aom_free(__base);
  }
  return _Var11;
}

Assistant:

bool ransac(const Correspondence *matched_points, int npoints,
            TransformationType type, MotionModel *motion_models,
            int num_desired_motions, bool *mem_alloc_failed) {
#if ALLOW_TRANSLATION_MODELS
  assert(type > IDENTITY && type < TRANS_TYPES);
#else
  assert(type > TRANSLATION && type < TRANS_TYPES);
#endif  // ALLOW_TRANSLATION_MODELS

  return ransac_internal(matched_points, npoints, motion_models,
                         num_desired_motions, &ransac_model_info[type],
                         mem_alloc_failed);
}